

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess.h
# Opt level: O2

void __thiscall
subprocess::Popen::Popen<subprocess::input,subprocess::output,subprocess::error>
          (Popen *this,string *cmd_args,input *args,output *args_1,error *args_2)

{
  size_type sVar1;
  size_type __pos;
  long in_FS_OFFSET;
  allocator<char> local_99;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->stream_).error_.super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2> =
       (__shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>)0x0;
  (this->stream_).output_.super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2> =
       (__shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>)0x0;
  (this->stream_).input_.super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2> =
       (__shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>)0x0;
  (this->stream_).write_to_child_ = -1;
  (this->stream_).read_from_parent_ = -1;
  (this->stream_).write_to_parent_ = -1;
  (this->stream_).read_from_child_ = -1;
  (this->stream_).err_write_ = -1;
  (this->stream_).err_read_ = -1;
  (this->stream_).comm_.stream_ = &this->stream_;
  (this->stream_).comm_.out_buf_cap_ = 0x2000;
  (this->stream_).comm_.err_buf_cap_ = 0x2000;
  (this->exe_name_)._M_dataplus._M_p = (pointer)&(this->exe_name_).field_2;
  (this->exe_name_)._M_string_length = 0;
  (this->exe_name_).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&this->args_,cmd_args);
  (this->cargv_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->cargv_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->vargs_).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  (this->vargs_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vargs_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->child_pid_ = -1;
  this->retcode_ = -1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78," \t",&local_99);
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __pos = 0;
  while( true ) {
    sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_first_of(cmd_args,&local_78,__pos);
    if (sVar1 == 0xffffffffffffffff) break;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_58,cmd_args,__pos,sVar1 - __pos);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
               &local_58);
    std::__cxx11::string::~string((string *)&local_58);
    __pos = sVar1 + 1;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_58,cmd_args,__pos,cmd_args->_M_string_length);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
             &local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&this->vargs_,&local_98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  init_args<subprocess::input,subprocess::output,subprocess::error>(this,args,args_1,args_2);
  detail::Streams::setup_comm_channels(&this->stream_);
  execute_process(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Popen(const std::string& cmd_args, Args&& ...args):
    args_(cmd_args)
  {
    vargs_ = util::split(cmd_args);
    init_args(std::forward<Args>(args)...);

    // Setup the communication channels of the Popen class
    stream_.setup_comm_channels();

    execute_process();
  }